

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDComponentPtr> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  uint uVar1;
  ON_SubDComponentPtr *this;
  ON_SubDEdge *local_50;
  uint local_44;
  undefined1 local_40 [4];
  uint i;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  uint count;
  ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges_local;
  uint minimum_chain_length_local;
  ON_SimpleArray<ON_SubDComponentPtr> *unsorted_edges_local;
  
  a.m_capacity = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount(unsorted_edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40,(ulong)(uint)a.m_capacity);
  for (local_44 = 0; local_44 < (uint)a.m_capacity; local_44 = local_44 + 1) {
    this = ON_SimpleArray<ON_SubDComponentPtr>::operator[](unsorted_edges,local_44);
    local_50 = ON_SubDComponentPtr::Edge(this);
    ON_SimpleArray<const_ON_SubDEdge_*>::Append
              ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40,&local_50);
  }
  uVar1 = SortEdgesIntoEdgeChains
                    ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40,minimum_chain_length,
                     sorted_edges);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray
            ((ON_SimpleArray<const_ON_SubDEdge_*> *)local_40);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDComponentPtr >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
    a.Append(unsorted_edges[i].Edge());
  return ON_SubDEdgeChain::SortEdgesIntoEdgeChains(a, minimum_chain_length, sorted_edges);
}